

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::updateDataForExecEntry
          (FederateState *this,MessageProcessingResult result,IterationRequest iterate)

{
  TimeCoordinator *pTVar1;
  long lVar2;
  Time TVar3;
  pointer pIVar4;
  pointer puVar5;
  bool bVar6;
  pointer puVar7;
  handle hStack_40;
  
  this->mGrantCount = this->mGrantCount + 1;
  if (result == NEXT_STEP) {
    pTVar1 = (this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
    lVar2 = (pTVar1->time_granted).internalTimeCode;
    (this->time_granted).internalTimeCode = lVar2;
    (this->allowed_send_time).internalTimeCode = lVar2 + (pTVar1->info).outputDelay.internalTimeCode
    ;
  }
  else {
    if (result == ERROR_RESULT) {
      return;
    }
    if (result == ITERATING) {
      *(undefined4 *)&(this->time_granted).internalTimeCode = 0xffffffff;
      *(undefined4 *)((long)&(this->time_granted).internalTimeCode + 4) = 0xffffffff;
      *(undefined4 *)&(this->allowed_send_time).internalTimeCode = 0xffffffff;
      *(undefined4 *)((long)&(this->allowed_send_time).internalTimeCode + 4) = 0xffffffff;
    }
  }
  if (iterate == NO_ITERATIONS) {
    TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
    if (this->wait_for_current_time == true) {
      pIVar4 = (this->events).
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->events).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
        (this->events).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish = pIVar4;
      }
      gmlc::libguarded::
      shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
      ::lock((handle *)&hStack_40,&(this->interfaceInformation).inputs);
      puVar5 = ((hStack_40.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = ((hStack_40.data)->dataStorage).
                    super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar5; puVar7 = puVar7 + 1
          ) {
        bVar6 = InputInfo::updateTimeInclusive
                          ((InputInfo *)
                           (puVar7->_M_t).
                           super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                           .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,TVar3)
        ;
        if (bVar6) {
          std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                    (&this->events,
                     &(((puVar7->_M_t).
                        super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                        .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).
                      handle);
        }
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&hStack_40.m_handle_lock);
      pIVar4 = (this->eventMessages).
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->eventMessages).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
        (this->eventMessages).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish = pIVar4;
      }
      gmlc::libguarded::
      shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
      ::lock(&hStack_40,&(this->interfaceInformation).endpoints);
      puVar5 = ((hStack_40.data)->dataStorage).
               super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = ((hStack_40.data)->dataStorage).
                    super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar5; puVar7 = puVar7 + 1
          ) {
        bVar6 = EndpointInfo::updateTimeInclusive
                          ((puVar7->_M_t).
                           super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                           .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,TVar3)
        ;
        if (bVar6) {
          std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::push_back
                    (&this->eventMessages,
                     &(((puVar7->_M_t).
                        super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                        .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).
                      handle);
        }
      }
      std::unique_lock<std::shared_mutex>::~unique_lock(&hStack_40.m_handle_lock);
      return;
    }
    fillEventVectorUpTo(this,TVar3);
    return;
  }
  if (iterate == ITERATE_IF_NEEDED) {
    TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
    if (result == NEXT_STEP) {
      fillEventVectorUpTo(this,TVar3);
      return;
    }
    fillEventVectorNextIteration(this,TVar3);
    return;
  }
  if (iterate != FORCE_ITERATION) {
    return;
  }
  fillEventVectorNextIteration(this,(Time)(this->time_granted).internalTimeCode);
  return;
}

Assistant:

void FederateState::updateDataForExecEntry(MessageProcessingResult result, IterationRequest iterate)
{
    ++mGrantCount;
    if (result == MessageProcessingResult::NEXT_STEP) {
        time_granted = timeCoord->getGrantedTime();
        allowed_send_time = timeCoord->allowedSendTime();
    } else if (result == MessageProcessingResult::ITERATING) {
        time_granted = initializationTime;
        allowed_send_time = initializationTime;
    }
    if (result != MessageProcessingResult::ERROR_RESULT) {
        switch (iterate) {
            case IterationRequest::FORCE_ITERATION:
                fillEventVectorNextIteration(time_granted);
                break;
            case IterationRequest::ITERATE_IF_NEEDED:
                if (result == MessageProcessingResult::NEXT_STEP) {
                    fillEventVectorUpTo(time_granted);
                } else {
                    fillEventVectorNextIteration(time_granted);
                }
                break;
            case IterationRequest::NO_ITERATIONS:
                if (wait_for_current_time) {
                    fillEventVectorInclusive(time_granted);
                } else {
                    fillEventVectorUpTo(time_granted);
                }
                break;
            default:
                break;
        }
    }
}